

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O3

size_t enet_range_coder_compress
                 (void *context,ENetBuffer *inBuffers,size_t inBufferCount,size_t inLimit,
                 enet_uint8 *outData,size_t outLimit)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  enet_uint16 eVar5;
  int iVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  ushort uVar10;
  ushort uVar11;
  short sVar12;
  ulong uVar13;
  short sVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  undefined4 uVar18;
  uint uVar19;
  undefined2 *puVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ENetBuffer *pEVar24;
  ulong uVar25;
  enet_uint8 *peVar26;
  bool bVar27;
  enet_uint16 predicted;
  ushort local_82;
  ushort *local_80;
  ulong local_78;
  undefined8 *local_70;
  ulong local_68;
  ENetBuffer *local_60;
  long local_58;
  byte *local_50;
  undefined4 local_44;
  byte *local_40;
  enet_uint8 *local_38;
  
  local_82 = 0;
  if (inLimit == 0 || (inBufferCount == 0 || context == (void *)0x0)) {
    return 0;
  }
  peVar26 = outData + outLimit;
  local_40 = (byte *)inBuffers->data;
  local_50 = local_40 + inBuffers->dataLength;
  pEVar24 = inBuffers + 1;
  lVar23 = inBufferCount - 1;
  *(undefined8 *)context = 0;
  *(undefined8 *)((long)context + 8) = 0;
  *(undefined4 *)((long)context + 10) = 0x1010001;
  uVar13 = 1;
  uVar17 = 0xffffffff;
  uVar25 = 0;
  local_68 = 0;
  local_70 = (undefined8 *)context;
  local_38 = outData;
LAB_00102616:
  local_80 = &local_82;
  uVar15 = (uint)uVar25;
  if (local_50 <= local_40) {
    if (lVar23 == 0) {
      while( true ) {
        if (uVar15 == 0) {
          return (long)outData - (long)local_38;
        }
        if (peVar26 <= outData) break;
        *outData = (enet_uint8)(uVar25 >> 0x18);
        outData = outData + 1;
        uVar15 = (int)uVar25 << 8;
        uVar25 = (ulong)uVar15;
      }
      return 0;
    }
    local_40 = (byte *)pEVar24->data;
    local_50 = local_40 + pEVar24->dataLength;
    pEVar24 = pEVar24 + 1;
    lVar23 = lVar23 + -1;
  }
  bVar2 = *local_40;
  uVar21 = uVar13;
  puVar7 = local_70;
  uVar4 = local_82;
  if (local_82 != 0) {
LAB_00102662:
    uVar21 = (ulong)uVar4;
    puVar8 = local_70 + uVar21 * 2;
    uVar10 = *(ushort *)(local_70 + uVar21 * 2 + 1);
    if (uVar10 == 0) {
      pbVar1 = (byte *)(local_70 + uVar13 * 2);
      *pbVar1 = bVar2;
      pbVar1[1] = 2;
      pbVar1[2] = 2;
      pbVar1[3] = 0;
      pbVar1[4] = 0;
      pbVar1[5] = 0;
      pbVar1[6] = 0;
      pbVar1[7] = 0;
      pbVar1[8] = 0;
      pbVar1[9] = 0;
      pbVar1[10] = 0;
      pbVar1[0xb] = 0;
      pbVar1[0xc] = 0;
      pbVar1[0xd] = 0;
      pbVar1[0xe] = 0;
      pbVar1[0xf] = 0;
      *(short *)(local_70 + uVar21 * 2 + 1) = (short)((int)uVar13 * 0x10 + (uint)uVar4 * -0x10 >> 4)
      ;
    }
    else {
      sVar14 = 0;
      puVar7 = puVar8;
      while( true ) {
        bVar3 = *(byte *)(puVar7 + (ulong)uVar10 * 2);
        puVar7 = puVar7 + (ulong)uVar10 * 2;
        while (bVar2 < bVar3) {
          *(short *)((long)puVar7 + 2) = *(short *)((long)puVar7 + 2) + 2;
          uVar4 = *(ushort *)((long)puVar7 + 4);
          if (uVar4 == 0) {
            puVar20 = (undefined2 *)((long)puVar7 + 4);
            goto LAB_001026d9;
          }
          bVar3 = *(byte *)(puVar7 + (ulong)uVar4 * 2);
          puVar7 = puVar7 + (ulong)uVar4 * 2;
        }
        if (bVar2 <= bVar3) {
          bVar3 = *(byte *)((long)puVar7 + 1);
          sVar12 = *(short *)((long)puVar7 + 2);
          *(short *)((long)puVar7 + 2) = sVar12 + 2;
          *(byte *)((long)puVar7 + 1) = bVar3 + 2;
          local_78 = uVar13;
          local_60 = pEVar24;
          local_58 = lVar23;
          *local_80 = (ushort)((uint)((int)puVar7 - (int)local_70) >> 4);
          uVar4 = *(ushort *)((long)puVar8 + 0xc);
          lVar23 = local_58;
          pEVar24 = local_60;
          local_80 = (ushort *)((long)puVar7 + 0xe);
          if (bVar3 == 0) goto LAB_00102763;
          iVar6 = (int)(uVar17 / uVar4);
          uVar15 = ((uint)*(ushort *)((long)puVar8 + 10) +
                   (uint)(ushort)(sVar12 + (sVar14 - (ushort)bVar3))) * iVar6 + (int)uVar25;
          uVar19 = iVar6 * (uint)bVar3;
          goto LAB_0010290b;
        }
        uVar10 = *(ushort *)((long)puVar7 + 6);
        if (uVar10 == 0) break;
        sVar14 = sVar14 + *(short *)((long)puVar7 + 2);
      }
      puVar20 = (undefined2 *)((long)puVar7 + 6);
LAB_001026d9:
      pbVar1 = (byte *)(local_70 + uVar13 * 2);
      *pbVar1 = bVar2;
      pbVar1[1] = 2;
      pbVar1[2] = 2;
      pbVar1[3] = 0;
      pbVar1[4] = 0;
      pbVar1[5] = 0;
      pbVar1[6] = 0;
      pbVar1[7] = 0;
      pbVar1[8] = 0;
      pbVar1[9] = 0;
      pbVar1[10] = 0;
      pbVar1[0xb] = 0;
      pbVar1[0xc] = 0;
      pbVar1[0xd] = 0;
      pbVar1[0xe] = 0;
      pbVar1[0xf] = 0;
      *puVar20 = (short)((uint)(((int)local_70 + (int)uVar13 * 0x10) - (int)puVar7) >> 4);
    }
    *local_80 = (ushort)uVar13;
    local_78 = uVar13 + 1;
    uVar4 = *(ushort *)((long)puVar8 + 0xc);
    local_80 = (ushort *)(pbVar1 + 0xe);
LAB_00102763:
    uVar10 = *(ushort *)((long)puVar8 + 10);
    if (uVar10 < uVar4 && uVar10 != 0) {
      uVar15 = (int)(uVar17 / uVar4) * (uint)uVar10;
      do {
        uVar17 = (ulong)uVar15;
        uVar19 = (uint)uVar25;
        if (0xffffff < (uVar15 + uVar19 ^ uVar19)) {
          if (0xffff < uVar15) goto LAB_001027cb;
          uVar15 = -uVar19 & 0xffff;
        }
        if (peVar26 <= outData) {
          return 0;
        }
        *outData = (enet_uint8)(uVar25 >> 0x18);
        outData = outData + 1;
        uVar15 = uVar15 << 8;
        uVar25 = (ulong)(uVar19 << 8);
      } while( true );
    }
    goto LAB_001027d3;
  }
LAB_0010298d:
  uVar11 = (ushort)bVar2;
  uVar4 = *(ushort *)(puVar7 + 1);
  puVar8 = puVar7;
  uVar10 = (ushort)bVar2;
  if (uVar4 == 0) {
    lVar22 = uVar21 * 0x10;
    *(byte *)(puVar7 + uVar21 * 2) = bVar2;
    *(undefined1 *)((long)puVar7 + lVar22 + 1) = 3;
    *(undefined2 *)((long)puVar7 + lVar22 + 2) = 3;
    *(undefined8 *)((long)puVar7 + lVar22 + 4) = 0;
    *(undefined4 *)((long)puVar7 + lVar22 + 0xc) = 0;
    *(short *)(puVar7 + 1) = (short)uVar21;
    uVar13 = uVar21 + 1;
    puVar9 = puVar7 + uVar21 * 2;
    uVar19 = 1;
  }
  else {
    do {
      uVar11 = uVar10;
      bVar3 = *(byte *)(puVar8 + (ulong)uVar4 * 2);
      puVar8 = puVar8 + (ulong)uVar4 * 2;
      while (bVar2 < bVar3) {
        *(short *)((long)puVar8 + 2) = *(short *)((long)puVar8 + 2) + 3;
        uVar4 = *(ushort *)((long)puVar8 + 4);
        if (uVar4 == 0) {
          uVar13 = uVar21 + 1;
          lVar22 = uVar21 * 0x10;
          puVar9 = puVar7 + uVar21 * 2;
          *(byte *)(puVar7 + uVar21 * 2) = bVar2;
          *(undefined1 *)((long)puVar7 + lVar22 + 1) = 3;
          *(undefined2 *)((long)puVar7 + lVar22 + 2) = 3;
          *(undefined8 *)((long)puVar7 + lVar22 + 4) = 0;
          *(undefined4 *)((long)puVar7 + lVar22 + 0xc) = 0;
          *(short *)((long)puVar8 + 4) = (short)((uint)((int)puVar9 - (int)puVar8) >> 4);
          uVar19 = 1;
          goto LAB_00102ac6;
        }
        bVar3 = *(byte *)(puVar8 + (ulong)uVar4 * 2);
        puVar8 = puVar8 + (ulong)uVar4 * 2;
      }
      if (bVar2 <= bVar3) {
        bVar2 = *(byte *)((long)puVar8 + 1);
        uVar19 = bVar2 + 1;
        uVar11 = (uVar11 - bVar2) + *(short *)((long)puVar8 + 2);
        *(short *)((long)puVar8 + 2) = *(short *)((long)puVar8 + 2) + 3;
        *(byte *)((long)puVar8 + 1) = bVar2 + 3;
        puVar9 = puVar8;
        uVar13 = uVar21;
        goto LAB_00102ac6;
      }
      uVar11 = uVar11 + *(short *)((long)puVar8 + 2);
      uVar4 = *(ushort *)((long)puVar8 + 6);
      uVar10 = uVar11;
    } while (uVar4 != 0);
    lVar22 = uVar21 * 0x10;
    *(byte *)(puVar7 + uVar21 * 2) = bVar2;
    *(undefined1 *)((long)puVar7 + lVar22 + 1) = 3;
    *(undefined2 *)((long)puVar7 + lVar22 + 2) = 3;
    *(undefined8 *)((long)puVar7 + lVar22 + 4) = 0;
    *(undefined4 *)((long)puVar7 + lVar22 + 0xc) = 0;
    *(short *)((long)puVar8 + 6) = (short)((uint)((int)(puVar7 + uVar21 * 2) - (int)puVar8) >> 4);
    uVar19 = 1;
    puVar9 = puVar7 + uVar21 * 2;
    uVar13 = uVar21 + 1;
  }
LAB_00102ac6:
  *local_80 = (ushort)((uint)((int)puVar9 - (int)puVar7) >> 4);
  iVar6 = (int)(uVar17 / *(ushort *)((long)puVar7 + 0xc));
  uVar15 = ((uint)uVar11 + (uint)*(ushort *)((long)puVar7 + 10)) * iVar6 + uVar15;
  uVar16 = iVar6 * uVar19;
  do {
    uVar25 = (ulong)uVar15;
    uVar17 = (ulong)uVar16;
    if (0xffffff < (uVar16 + uVar15 ^ uVar15)) {
      if (0xffff < uVar16) goto LAB_00102b38;
      uVar16 = -uVar15 & 0xffff;
    }
    if (peVar26 <= outData) {
      return 0;
    }
    *outData = (enet_uint8)(uVar15 >> 0x18);
    outData = outData + 1;
    uVar16 = uVar16 << 8;
    uVar15 = uVar15 << 8;
  } while( true );
LAB_0010290b:
  uVar25 = (ulong)uVar15;
  uVar17 = (ulong)uVar19;
  if (0xffffff < (uVar19 + uVar15 ^ uVar15)) {
    if (0xffff < uVar19) goto LAB_00102971;
    uVar19 = -uVar15 & 0xffff;
  }
  if (peVar26 <= outData) {
    return 0;
  }
  *outData = (enet_uint8)(uVar15 >> 0x18);
  outData = outData + 1;
  uVar19 = uVar19 << 8;
  uVar15 = uVar15 << 8;
  goto LAB_0010290b;
LAB_00102971:
  sVar14 = *(short *)((long)puVar8 + 0xc);
  bVar27 = 0xfb < bVar3;
  uVar18 = 1;
  goto LAB_001027e5;
LAB_001027cb:
  uVar10 = *(ushort *)((long)puVar8 + 10);
  uVar4 = *(ushort *)((long)puVar8 + 0xc);
LAB_001027d3:
  *(ushort *)((long)puVar8 + 10) = uVar10 + 5;
  sVar14 = uVar4 + 5;
  *(short *)((long)puVar8 + 0xc) = sVar14;
  uVar18 = 0;
  bVar27 = false;
LAB_001027e5:
  uVar15 = (uint)uVar25;
  *(ushort *)((long)puVar8 + 0xc) = sVar14 + 2U;
  if ((bVar27) || (uVar13 = local_78, puVar7 = local_70, 0xff00 < (ushort)(sVar14 + 2U))) {
    if (*(ushort *)(puVar8 + 1) == 0) {
      eVar5 = 0;
    }
    else {
      local_60 = pEVar24;
      local_58 = lVar23;
      local_44 = uVar18;
      eVar5 = enet_symbol_rescale((ENetSymbol *)(puVar8 + (ulong)*(ushort *)(puVar8 + 1) * 2));
      lVar23 = local_58;
      pEVar24 = local_60;
      uVar18 = local_44;
    }
    sVar14 = *(ushort *)((long)puVar8 + 10) - (*(ushort *)((long)puVar8 + 10) >> 1);
    *(short *)((long)puVar8 + 10) = sVar14;
    *(enet_uint16 *)((long)puVar8 + 0xc) = eVar5 + sVar14;
    uVar13 = local_78;
    puVar7 = local_70;
  }
  if ((char)uVar18 != '\0') goto LAB_00102bcf;
  uVar21 = uVar13;
  local_70 = puVar7;
  uVar4 = *(ushort *)((long)puVar8 + 0xe);
  if (*(ushort *)((long)puVar8 + 0xe) == 0) goto LAB_0010298d;
  goto LAB_00102662;
LAB_00102b38:
  uVar4 = *(short *)((long)puVar7 + 0xc) + 3;
  *(ushort *)((long)puVar7 + 0xc) = uVar4;
  if (0xff00 < uVar4 || 0xfa < uVar19) {
    if (*(ushort *)(puVar7 + 1) == 0) {
      sVar14 = 0x100;
    }
    else {
      local_78 = uVar13;
      local_70 = puVar7;
      eVar5 = enet_symbol_rescale((ENetSymbol *)(puVar7 + (ulong)*(ushort *)(puVar7 + 1) * 2));
      sVar14 = eVar5 + 0x100;
      uVar13 = local_78;
      puVar7 = local_70;
    }
    sVar12 = *(ushort *)((long)puVar7 + 10) - (*(ushort *)((long)puVar7 + 10) >> 1);
    *(short *)((long)puVar7 + 10) = sVar12;
    *(short *)((long)puVar7 + 0xc) = sVar14 + sVar12;
  }
LAB_00102bcf:
  if (local_68 < 2) {
    local_68 = local_68 + 1;
  }
  else {
    local_82 = *(ushort *)((long)puVar7 + (ulong)local_82 * 0x10 + 0xe);
    local_68 = 2;
  }
  local_40 = local_40 + 1;
  local_70 = puVar7;
  if (0xffd < uVar13) {
    *puVar7 = 0;
    puVar7[1] = 0;
    *(undefined4 *)((long)puVar7 + 10) = 0x1010001;
    local_82 = 0;
    local_68 = 0;
    uVar13 = 1;
  }
  goto LAB_00102616;
}

Assistant:

size_t
enet_range_coder_compress (void * context, const ENetBuffer * inBuffers, size_t inBufferCount, size_t inLimit, enet_uint8 * outData, size_t outLimit)
{
    ENetRangeCoder * rangeCoder = (ENetRangeCoder *) context;
    enet_uint8 * outStart = outData, * outEnd = & outData [outLimit];
    const enet_uint8 * inData, * inEnd;
    enet_uint32 encodeLow = 0, encodeRange = ~0;
    ENetSymbol * root;
    enet_uint16 predicted = 0;
    size_t order = 0, nextSymbol = 0;

    if (rangeCoder == NULL || inBufferCount <= 0 || inLimit <= 0)
      return 0;

    inData = (const enet_uint8 *) inBuffers -> data;
    inEnd = & inData [inBuffers -> dataLength];
    inBuffers ++;
    inBufferCount --;

    ENET_CONTEXT_CREATE (root, ENET_CONTEXT_ESCAPE_MINIMUM, ENET_CONTEXT_SYMBOL_MINIMUM);

    for (;;)
    {
        ENetSymbol * subcontext, * symbol;
#ifdef ENET_CONTEXT_EXCLUSION
        const ENetSymbol * childContext = & emptyContext;
#endif
        enet_uint8 value;
        enet_uint16 count, under, * parent = & predicted, total;
        if (inData >= inEnd)
        {
            if (inBufferCount <= 0)
              break;
            inData = (const enet_uint8 *) inBuffers -> data;
            inEnd = & inData [inBuffers -> dataLength];
            inBuffers ++;
            inBufferCount --;
        }
        value = * inData ++;
    
        for (subcontext = & rangeCoder -> symbols [predicted]; 
             subcontext != root; 
#ifdef ENET_CONTEXT_EXCLUSION
             childContext = subcontext, 
#endif
                subcontext = & rangeCoder -> symbols [subcontext -> parent])
        {
            ENET_CONTEXT_ENCODE (subcontext, symbol, value, under, count, ENET_SUBCONTEXT_SYMBOL_DELTA, 0);
            * parent = symbol - rangeCoder -> symbols;
            parent = & symbol -> parent;
            total = subcontext -> total;
#ifdef ENET_CONTEXT_EXCLUSION
            if (childContext -> total > ENET_SUBCONTEXT_SYMBOL_DELTA + ENET_SUBCONTEXT_ESCAPE_DELTA)
              ENET_CONTEXT_ENCODE_EXCLUDE (childContext, value, under, total, 0);
#endif
            if (count > 0)
            {
                ENET_RANGE_CODER_ENCODE (subcontext -> escapes + under, count, total);
            }
            else
            {
                if (subcontext -> escapes > 0 && subcontext -> escapes < total) 
                    ENET_RANGE_CODER_ENCODE (0, subcontext -> escapes, total); 
                subcontext -> escapes += ENET_SUBCONTEXT_ESCAPE_DELTA;
                subcontext -> total += ENET_SUBCONTEXT_ESCAPE_DELTA;
            }
            subcontext -> total += ENET_SUBCONTEXT_SYMBOL_DELTA;
            if (count > 0xFF - 2*ENET_SUBCONTEXT_SYMBOL_DELTA || subcontext -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
              ENET_CONTEXT_RESCALE (subcontext, 0);
            if (count > 0) goto nextInput;
        }

        ENET_CONTEXT_ENCODE (root, symbol, value, under, count, ENET_CONTEXT_SYMBOL_DELTA, ENET_CONTEXT_SYMBOL_MINIMUM);
        * parent = symbol - rangeCoder -> symbols;
        parent = & symbol -> parent;
        total = root -> total;
#ifdef ENET_CONTEXT_EXCLUSION
        if (childContext -> total > ENET_SUBCONTEXT_SYMBOL_DELTA + ENET_SUBCONTEXT_ESCAPE_DELTA)
          ENET_CONTEXT_ENCODE_EXCLUDE (childContext, value, under, total, ENET_CONTEXT_SYMBOL_MINIMUM); 
#endif
        ENET_RANGE_CODER_ENCODE (root -> escapes + under, count, total);
        root -> total += ENET_CONTEXT_SYMBOL_DELTA; 
        if (count > 0xFF - 2*ENET_CONTEXT_SYMBOL_DELTA + ENET_CONTEXT_SYMBOL_MINIMUM || root -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
          ENET_CONTEXT_RESCALE (root, ENET_CONTEXT_SYMBOL_MINIMUM);

    nextInput:
        if (order >= ENET_SUBCONTEXT_ORDER) 
          predicted = rangeCoder -> symbols [predicted].parent;
        else 
          order ++;
        ENET_RANGE_CODER_FREE_SYMBOLS;
    }

    ENET_RANGE_CODER_FLUSH;

    return (size_t) (outData - outStart);
}